

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void do_cmd_pathfind(command *cmd)

{
  player_upkeep *ppVar1;
  player *ppVar2;
  wchar_t wVar3;
  loc grid;
  loc local_10;
  
  cmd_get_arg_point((command_conflict *)cmd,"point",&local_10);
  if (player->timed[4] == 0) {
    if (player->upkeep->steps != (int16_t *)0x0) {
      __assert_fail("!player->upkeep->steps",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-cave.c"
                    ,0x727,"void do_cmd_pathfind(struct command *)");
    }
    wVar3 = find_path(player,player->grid,(loc_conflict)local_10,&player->upkeep->steps);
    ppVar2 = player;
    ppVar1 = player->upkeep;
    ppVar1->step_count = wVar3;
    if (L'\0' < wVar3) {
      (ppVar1->path_dest).x = local_10.x;
      (ppVar1->path_dest).y = local_10.y;
      ppVar1 = ppVar2->upkeep;
      ppVar1->running = ppVar1->step_count;
      *(byte *)&ppVar1->update = (byte)ppVar1->update | 2;
      run_step(L'\0');
    }
  }
  return;
}

Assistant:

void do_cmd_pathfind(struct command *cmd)
{
	struct loc grid;

	/* XXX-AS Add better arg checking */
	cmd_get_arg_point(cmd, "point", &grid);

	if (player->timed[TMD_CONFUSED])
		return;

	assert(!player->upkeep->steps);
	player->upkeep->step_count =
		find_path(player, player->grid, grid, &player->upkeep->steps);
	if (player->upkeep->step_count > 0) {
		player->upkeep->path_dest = grid;
		player->upkeep->running = player->upkeep->step_count;
		/* Calculate torch radius */
		player->upkeep->update |= (PU_TORCH);
		run_step(0);
	}
}